

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O0

void __thiscall
xmrig::MinerPrivate::getMiner(MinerPrivate *this,Value *reply,Document *doc,int param_4)

{
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RSI;
  Document *in_stack_00000048;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  char *in_stack_fffffffffffffec8;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_00;
  undefined1 value;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffff28;
  GenericStringRef<char> *this_00;
  StringRefType *in_stack_ffffffffffffff30;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_01;
  StringRefType *in_stack_ffffffffffffff38;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff40;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_a8;
  GenericStringRef<char> local_98;
  undefined1 local_88 [32];
  GenericStringRef<char> local_68;
  GenericStringRef<char> local_58;
  GenericStringRef<char> local_48;
  GenericStringRef<char> local_38;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_28;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_10;
  
  local_10 = in_RSI;
  local_28 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  rapidjson::GenericStringRef<char>::GenericStringRef<8u>(&local_38,(char (*) [8])0x27c3f7);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_48,(char (*) [6])"5.0.0");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
            in_stack_ffffffffffffff28);
  rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_58,(char (*) [5])"kind");
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_68,(char (*) [6])"miner");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
            in_stack_ffffffffffffff28);
  rapidjson::GenericStringRef<char>::GenericStringRef<3u>
            ((GenericStringRef<char> *)(local_88 + 0x10),(char (*) [3])"ua");
  Platform::userAgent();
  allocator_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_88;
  rapidjson::StringRef<char>(in_stack_fffffffffffffec8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
            in_stack_ffffffffffffff28);
  this_00 = &local_98;
  rapidjson::GenericStringRef<char>::GenericStringRef<4u>(this_00,(char (*) [4])0x2791b0);
  this_01 = &local_a8;
  Cpu::toJSON(in_stack_00000048);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(this_01,this_00,local_10,allocator_00);
  value = (undefined1)((ulong)local_10 >> 0x38);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_a8);
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>
            ((GenericStringRef<char> *)&stack0xffffffffffffff38,(char (*) [7])0x27c6e5);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>(this_01,this_00,(bool)value,allocator_00);
  return;
}

Assistant:

void getMiner(rapidjson::Value &reply, rapidjson::Document &doc, int) const
    {
        using namespace rapidjson;
        auto &allocator = doc.GetAllocator();

        reply.AddMember("version",      APP_VERSION, allocator);
        reply.AddMember("kind",         APP_KIND, allocator);
        reply.AddMember("ua",           StringRef(Platform::userAgent()), allocator);
        reply.AddMember("cpu",          Cpu::toJSON(doc), allocator);
        reply.AddMember("paused",       !enabled, allocator);
    }